

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

HighsStatus
ipxBasicSolutionToHighsBasicSolution
          (HighsLogOptions *log_options,HighsLp *lp,vector<double,_std::allocator<double>_> *rhs,
          vector<char,_std::allocator<char>_> *constraint_type,IpxSolution *ipx_solution,
          HighsBasis *highs_basis,HighsSolution *highs_solution)

{
  value_type vVar1;
  HighsLogOptions *pHVar2;
  double dVar3;
  value_type vVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  const_reference pvVar8;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  uint *puVar12;
  const_reference pvVar13;
  vector<char,_std::allocator<char>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  uint *in_RSI;
  HighsLogOptions *in_RDI;
  long in_R8;
  undefined1 *in_R9;
  bool bVar14;
  bool bVar15;
  double dVar16;
  undefined1 *in_stack_00000008;
  HighsInt iRow;
  HighsInt iCol;
  double dual_1;
  double value_1;
  double dual;
  double value;
  double slack_dual;
  double slack_value;
  HighsInt this_ipx_row;
  double upper;
  double lower;
  bool unrecognised_1;
  HighsInt row_1;
  HighsInt num_boxed_row_slacks_basic;
  HighsInt num_boxed_rows_basic;
  HighsInt num_boxed_rows;
  HighsInt ipx_slack;
  HighsInt ipx_row;
  HighsInt row;
  HighsInt el;
  bool unrecognised;
  HighsInt col;
  HighsInt num_basic_variables;
  bool get_row_activities;
  vector<double,_std::allocator<double>_> row_activity;
  Int ipx_superbasic;
  Int ipx_nonbasic_at_ub;
  Int ipx_nonbasic_at_lb;
  Int ipx_basic;
  vector<int,_std::allocator<int>_> *ipx_row_status;
  vector<int,_std::allocator<int>_> *ipx_col_status;
  vector<double,_std::allocator<double>_> *ipx_row_dual;
  vector<double,_std::allocator<double>_> *ipx_col_dual;
  vector<double,_std::allocator<double>_> *ipx_row_value;
  vector<double,_std::allocator<double>_> *ipx_col_value;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  uint in_stack_fffffffffffffd50;
  uint in_stack_fffffffffffffd54;
  size_type in_stack_fffffffffffffd58;
  HighsLogOptions *pHVar17;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  value_type local_249;
  int local_130;
  int local_12c;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  int local_c0;
  uint local_b4;
  vector<double,_std::allocator<double>_> local_90;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  vector<int,_std::allocator<int>_> *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  undefined1 *local_38;
  long local_30;
  vector<char,_std::allocator<char>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  uint *local_18;
  HighsLogOptions *local_10;
  HighsStatus local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
            );
  local_40 = (vector<double,_std::allocator<double>_> *)(local_30 + 8);
  local_48 = (vector<double,_std::allocator<double>_> *)(local_30 + 0x20);
  local_50 = (vector<double,_std::allocator<double>_> *)(local_30 + 0x38);
  local_58 = (vector<double,_std::allocator<double>_> *)(local_30 + 0x50);
  local_60 = (vector<int,_std::allocator<int>_> *)(local_30 + 0x68);
  local_68 = (vector<int,_std::allocator<int>_> *)(local_30 + 0x80);
  local_6c = 0;
  local_70 = 0xffffffff;
  local_74 = 0xfffffffe;
  local_78 = 0xfffffffd;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x52776d);
  bVar15 = *(int *)(local_30 + 4) < (int)local_18[1];
  if (bVar15) {
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               (value_type_conflict1 *)0x5277c6);
  }
  for (local_b4 = 0; (int)local_b4 < (int)*local_18; local_b4 = local_b4 + 1) {
    bVar14 = false;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)(int)local_b4);
    if (*pvVar8 == 0) {
      pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_38 + 0x30),(long)(int)local_b4);
      *pvVar9 = kBasic;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (local_40,(long)(int)local_b4);
      vVar1 = *pvVar10;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 8),
                           (long)(int)local_b4);
      *pvVar11 = vVar1;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x20),
                           (long)(int)local_b4);
      *pvVar11 = 0.0;
    }
    else {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)(int)local_b4);
      if (*pvVar8 == -1) {
        pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (local_38 + 0x30),(long)(int)local_b4);
        *pvVar9 = kLower;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_40,(long)(int)local_b4);
        vVar1 = *pvVar10;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 8),
                             (long)(int)local_b4);
        *pvVar11 = vVar1;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_50,(long)(int)local_b4);
        vVar1 = *pvVar10;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x20),
                             (long)(int)local_b4);
        *pvVar11 = vVar1;
      }
      else {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)(int)local_b4);
        if (*pvVar8 == -2) {
          pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_38 + 0x30),(long)(int)local_b4);
          *pvVar9 = kUpper;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_40,(long)(int)local_b4);
          vVar1 = *pvVar10;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 8),
                               (long)(int)local_b4);
          *pvVar11 = vVar1;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_50,(long)(int)local_b4);
          vVar1 = *pvVar10;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x20)
                               ,(long)(int)local_b4);
          *pvVar11 = vVar1;
        }
        else {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)(int)local_b4);
          pHVar2 = local_10;
          bVar14 = *pvVar8 != -3;
          if (bVar14) {
            puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                        (local_60,(long)(int)local_b4);
            highsLogDev(pHVar2,kError,
                        "\nError in IPX conversion: Unrecognised value ipx_col_status[%2d] = %d\n",
                        (ulong)local_b4,(ulong)*puVar12);
          }
          else {
            pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_38 + 0x30),(long)(int)local_b4);
            *pvVar9 = kZero;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_40,(long)(int)local_b4);
            vVar1 = *pvVar10;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 8),
                                 (long)(int)local_b4);
            *pvVar11 = vVar1;
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_50,(long)(int)local_b4);
            vVar1 = *pvVar10;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 (in_stack_00000008 + 0x20),(long)(int)local_b4);
            *pvVar11 = vVar1;
          }
        }
      }
    }
    pHVar2 = local_10;
    if (bVar14) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                           (long)(int)local_b4);
      pHVar17 = (HighsLogOptions *)*pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                           (long)(int)local_b4);
      highsLogDev(pHVar17,(HighsLogType)*pvVar10,(char *)pHVar2,5,"Bounds [%11.4g, %11.4g]\n");
      pHVar17 = local_10;
      puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                  (local_60,(long)(int)local_b4);
      uVar5 = *puVar12;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (local_40,(long)(int)local_b4);
      pHVar2 = (HighsLogOptions *)*pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          (local_50,(long)(int)local_b4);
      highsLogDev(pHVar2,(HighsLogType)*pvVar10,(char *)pHVar17,5,
                  "Col %2d ipx_col_status[%2d] = %2d; x[%2d] = %11.4g; z[%2d] = %11.4g\n",
                  (ulong)local_b4,(ulong)local_b4,(ulong)uVar5,local_b4,local_b4);
      highsLogUser(local_10,kError,"Unrecognised ipx_col_status value from IPX\n");
      local_4 = kError;
      goto LAB_00528b53;
    }
    if (bVar15) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),(long)(int)local_b4
                         );
      for (local_c0 = *pvVar8;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0x24),
                              (long)(int)(local_b4 + 1)), local_c0 < *pvVar8;
          local_c0 = local_c0 + 1) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_18 + 0x30),(long)local_c0);
        iVar6 = *pvVar8;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 8),
                             (long)(int)local_b4);
        dVar16 = *pvVar11;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(local_18 + 0x36),
                             (long)local_c0);
        dVar3 = *pvVar10;
        pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)iVar6);
        *pvVar11 = dVar16 * dVar3 + *pvVar11;
      }
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(local_38 + 0x30),
               (long)(int)local_b4);
  }
  local_c8 = 0;
  local_cc = *local_18;
  local_d0 = 0;
  local_d4 = 0;
  local_d8 = 0;
  local_dc = 0;
  do {
    uVar5 = local_c8;
    if ((int)local_18[1] <= (int)local_dc) {
      if (local_18[0x3c] == 0xffffffff) {
        for (local_12c = 0; local_12c < (int)*local_18; local_12c = local_12c + 1) {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x20)
                               ,(long)local_12c);
          *pvVar11 = *pvVar11 * -1.0;
        }
        for (local_130 = 0; local_130 < (int)local_18[1]; local_130 = local_130 + 1) {
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x50)
                               ,(long)local_130);
          *pvVar11 = *pvVar11 * -1.0;
        }
      }
      if (local_d0 != 0) {
        highsLogDev(local_10,kInfo,"Of %d boxed rows: %d are basic and %d have basic slacks\n",
                    (ulong)local_d0,(ulong)local_d4,(ulong)local_d8);
      }
      *in_stack_00000008 = 1;
      in_stack_00000008[1] = 1;
      *local_38 = 1;
      local_38[2] = 1;
      local_4 = kOk;
LAB_00528b53:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      return local_4;
    }
    bVar15 = false;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                         (long)(int)local_dc);
    dVar16 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                         (long)(int)local_dc);
    dVar3 = *pvVar10;
    if ((-INFINITY < dVar16) || (dVar3 < INFINITY)) {
      if ((dVar16 <= -INFINITY) || ((INFINITY <= dVar3 || (dVar3 <= dVar16)))) {
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_68,(long)(int)local_c8);
        if (*pvVar8 == 0) {
          pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_38 + 0x48),(long)(int)local_dc);
          *pvVar9 = kBasic;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_20,(long)(int)local_c8);
          dVar16 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_48,(long)(int)local_c8);
          dVar3 = *pvVar10;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x38)
                               ,(long)(int)local_dc);
          *pvVar11 = dVar16 - dVar3;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x50)
                               ,(long)(int)local_dc);
          *pvVar11 = 0.0;
        }
        else {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_20,(long)(int)local_c8);
          dVar16 = *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_48,(long)(int)local_c8);
          dVar16 = dVar16 - *pvVar10;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_58,(long)(int)local_c8);
          dVar3 = *pvVar10;
          pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                              (local_28,(long)(int)local_c8);
          if (*pvVar13 == '>') {
            pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_38 + 0x48),(long)(int)local_dc);
            *pvVar9 = kLower;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 (in_stack_00000008 + 0x38),(long)(int)local_dc);
            *pvVar11 = dVar16;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 (in_stack_00000008 + 0x50),(long)(int)local_dc);
            *pvVar11 = dVar3;
          }
          else {
            pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                                (local_28,(long)(int)local_c8);
            if (*pvVar13 == '<') {
              pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                                 ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                  (local_38 + 0x48),(long)(int)local_dc);
              *pvVar9 = kUpper;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   (in_stack_00000008 + 0x38),(long)(int)local_dc);
              *pvVar11 = dVar16;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   (in_stack_00000008 + 0x50),(long)(int)local_dc);
              *pvVar11 = dVar3;
            }
            else {
              pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                                  (local_28,(long)(int)local_c8);
              pHVar2 = local_10;
              if (*pvVar13 == '=') {
                local_249 = kLower;
                if (dVar3 < 0.0) {
                  local_249 = kUpper;
                }
                pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
                         operator[]((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                    (local_38 + 0x48),(long)(int)local_dc);
                *pvVar9 = local_249;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     (in_stack_00000008 + 0x38),(long)(int)local_dc);
                *pvVar11 = dVar16;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     (in_stack_00000008 + 0x50),(long)(int)local_dc);
                *pvVar11 = dVar3;
              }
              else {
                bVar15 = true;
                pvVar13 = std::vector<char,_std::allocator<char>_>::operator[]
                                    (local_28,(long)(int)local_c8);
                highsLogDev(pHVar2,kError,
                            "Error in IPX conversion: Row %2d: cannot handle constraint_type[%2d] = %d\n"
                            ,(ulong)local_dc,(ulong)local_c8,(ulong)(uint)(int)*pvVar13);
              }
            }
          }
        }
      }
      else {
        local_d0 = local_d0 + 1;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_40,(long)(int)local_cc);
        vVar1 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            (local_50,(long)(int)local_cc);
        vVar4 = *pvVar10;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_68,(long)(int)local_c8);
        if (*pvVar8 == 0) {
          local_d4 = local_d4 + 1;
          pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_38 + 0x48),(long)(int)local_dc);
          *pvVar9 = kBasic;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x38)
                               ,(long)(int)local_dc);
          *pvVar11 = vVar1;
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x50)
                               ,(long)(int)local_dc);
          *pvVar11 = 0.0;
        }
        else {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_60,(long)(int)local_cc);
          if (*pvVar8 == 0) {
            local_d8 = local_d8 + 1;
            pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                               ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                (local_38 + 0x48),(long)(int)local_dc);
            *pvVar9 = kBasic;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 (in_stack_00000008 + 0x38),(long)(int)local_dc);
            *pvVar11 = vVar1;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 (in_stack_00000008 + 0x50),(long)(int)local_dc);
            *pvVar11 = 0.0;
          }
          else {
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_60,(long)(int)local_cc);
            if (*pvVar8 == -1) {
              pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                                 ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                  (local_38 + 0x48),(long)(int)local_dc);
              *pvVar9 = kLower;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   (in_stack_00000008 + 0x38),(long)(int)local_dc);
              *pvVar11 = vVar1;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   (in_stack_00000008 + 0x50),(long)(int)local_dc);
              *pvVar11 = vVar4;
            }
            else {
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (local_60,(long)(int)local_cc);
              pHVar2 = local_10;
              bVar15 = *pvVar8 != -2;
              if (bVar15) {
                pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (local_60,(long)(int)local_cc);
                highsLogDev(pHVar2,kError,
                            "Error in IPX conversion: Row %2d (IPX row %2d) has unrecognised value ipx_col_status[%2d] = %d\n"
                            ,(ulong)local_dc,(ulong)local_c8,(ulong)local_cc,*pvVar8);
              }
              else {
                pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
                         operator[]((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                                    (local_38 + 0x48),(long)(int)local_dc);
                *pvVar9 = kUpper;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     (in_stack_00000008 + 0x38),(long)(int)local_dc);
                *pvVar11 = vVar1;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     (in_stack_00000008 + 0x50),(long)(int)local_dc);
                *pvVar11 = vVar4;
              }
            }
          }
        }
        local_cc = local_cc + 1;
      }
      local_c8 = local_c8 + 1;
    }
    else {
      pvVar9 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (local_38 + 0x48),(long)(int)local_dc);
      *pvVar9 = kBasic;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          (&local_90,(long)(int)local_dc);
      vVar1 = *pvVar11;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x38),
                           (long)(int)local_dc);
      *pvVar11 = vVar1;
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_stack_00000008 + 0x50),
                           (long)(int)local_dc);
      *pvVar11 = 0.0;
    }
    pHVar2 = local_10;
    if (bVar15) {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(local_18 + 0x14),
                           (long)(int)local_dc);
      pHVar17 = (HighsLogOptions *)*pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(local_18 + 0x1a),
                           (long)(int)local_dc);
      highsLogDev(pHVar17,(HighsLogType)*pvVar10,(char *)pHVar2,5,"Bounds [%11.4g, %11.4g]\n");
      pHVar17 = local_10;
      puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                  (local_68,(long)(int)uVar5);
      uVar7 = *puVar12;
      in_stack_fffffffffffffd54 = uVar5;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](local_48,(long)(int)uVar5);
      pHVar2 = (HighsLogOptions *)*pvVar10;
      in_stack_fffffffffffffd50 = uVar5;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](local_58,(long)(int)uVar5);
      highsLogDev(pHVar2,(HighsLogType)*pvVar10,(char *)pHVar17,5,
                  "Row %2d ipx_row_status[%2d] = %2d; s[%2d] = %11.4g; y[%2d] = %11.4g\n",
                  (ulong)local_dc,(ulong)uVar5,(ulong)uVar7,in_stack_fffffffffffffd54,
                  in_stack_fffffffffffffd50);
      highsLogUser(local_10,kError,"Unrecognised ipx_row_status value from IPX\n");
      local_4 = kError;
      goto LAB_00528b53;
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(local_38 + 0x48),
               (long)(int)local_dc);
    local_dc = local_dc + 1;
  } while( true );
}

Assistant:

HighsStatus ipxBasicSolutionToHighsBasicSolution(
    const HighsLogOptions& log_options, const HighsLp& lp,
    const std::vector<double>& rhs, const std::vector<char>& constraint_type,
    const IpxSolution& ipx_solution, HighsBasis& highs_basis,
    HighsSolution& highs_solution) {
  // Resize the HighsSolution and HighsBasis
  highs_solution.col_value.resize(lp.num_col_);
  highs_solution.row_value.resize(lp.num_row_);
  highs_solution.col_dual.resize(lp.num_col_);
  highs_solution.row_dual.resize(lp.num_row_);
  highs_basis.col_status.resize(lp.num_col_);
  highs_basis.row_status.resize(lp.num_row_);

  const std::vector<double>& ipx_col_value = ipx_solution.ipx_col_value;
  const std::vector<double>& ipx_row_value = ipx_solution.ipx_row_value;
  const std::vector<double>& ipx_col_dual = ipx_solution.ipx_col_dual;
  const std::vector<double>& ipx_row_dual = ipx_solution.ipx_row_dual;
  const std::vector<ipx::Int>& ipx_col_status = ipx_solution.ipx_col_status;
  const std::vector<ipx::Int>& ipx_row_status = ipx_solution.ipx_row_status;

  // Set up meaningful names for values of ipx_col_status and ipx_row_status to
  // be used later in comparisons
  const ipx::Int ipx_basic = 0;
  const ipx::Int ipx_nonbasic_at_lb = -1;
  const ipx::Int ipx_nonbasic_at_ub = -2;
  const ipx::Int ipx_superbasic = -3;
  // Row activities are needed to set activity values of free rows -
  // which are ignored by IPX
  vector<double> row_activity;
  bool get_row_activities = ipx_solution.num_row < lp.num_row_;
  if (get_row_activities) row_activity.assign(lp.num_row_, 0);
  HighsInt num_basic_variables = 0;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    bool unrecognised = false;
    if (ipx_col_status[col] == ipx_basic) {
      // Column is basic
      highs_basis.col_status[col] = HighsBasisStatus::kBasic;
      highs_solution.col_value[col] = ipx_col_value[col];
      highs_solution.col_dual[col] = 0;
    } else {
      // Column is nonbasic. Setting of ipx_col_status is consistent
      // with dual value for fixed columns
      if (ipx_col_status[col] == ipx_nonbasic_at_lb) {
        // Column is at lower bound
        highs_basis.col_status[col] = HighsBasisStatus::kLower;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_nonbasic_at_ub) {
        // Column is at upper bound
        highs_basis.col_status[col] = HighsBasisStatus::kUpper;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else if (ipx_col_status[col] == ipx_superbasic) {
        // Column is superbasic
        highs_basis.col_status[col] = HighsBasisStatus::kZero;
        highs_solution.col_value[col] = ipx_col_value[col];
        highs_solution.col_dual[col] = ipx_col_dual[col];
      } else {
        unrecognised = true;
        highsLogDev(log_options, HighsLogType::kError,
                    "\nError in IPX conversion: Unrecognised value "
                    "ipx_col_status[%2" HIGHSINT_FORMAT
                    "] = "
                    "%" HIGHSINT_FORMAT "\n",
                    col, (HighsInt)ipx_col_status[col]);
      }
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.col_lower_[col],
                  lp.col_upper_[col]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Col %2" HIGHSINT_FORMAT " ipx_col_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; x[%2" HIGHSINT_FORMAT
                  "] = %11.4g; z[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  col, col, (HighsInt)ipx_col_status[col], col,
                  ipx_col_value[col], col, ipx_col_dual[col]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_col_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (get_row_activities) {
      // Accumulate row activities to assign value to free rows
      for (HighsInt el = lp.a_matrix_.start_[col];
           el < lp.a_matrix_.start_[col + 1]; el++) {
        HighsInt row = lp.a_matrix_.index_[el];
        row_activity[row] +=
            highs_solution.col_value[col] * lp.a_matrix_.value_[el];
      }
    }
    if (highs_basis.col_status[col] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  HighsInt ipx_row = 0;
  HighsInt ipx_slack = lp.num_col_;
  HighsInt num_boxed_rows = 0;
  HighsInt num_boxed_rows_basic = 0;
  HighsInt num_boxed_row_slacks_basic = 0;
  for (HighsInt row = 0; row < lp.num_row_; row++) {
    bool unrecognised = false;
    double lower = lp.row_lower_[row];
    double upper = lp.row_upper_[row];
    HighsInt this_ipx_row = ipx_row;
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free row - removed by IPX so make it basic at its row activity
      highs_basis.row_status[row] = HighsBasisStatus::kBasic;
      highs_solution.row_value[row] = row_activity[row];
      highs_solution.row_dual[row] = 0;
    } else {
      // Non-free row, so IPX will have it
      if ((lower > -kHighsInf && upper < kHighsInf) && (lower < upper)) {
        // Boxed row - look at its slack
        num_boxed_rows++;
        double slack_value = ipx_col_value[ipx_slack];
        double slack_dual = ipx_col_dual[ipx_slack];
        double value = slack_value;
        // @FlipRowDual -slack_dual became slack_dual
        double dual = slack_dual;
        if (ipx_row_status[ipx_row] == ipx_basic) {
          // Row is basic
          num_boxed_rows_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_basic) {
          // Slack is basic
          num_boxed_row_slacks_basic++;
          highs_basis.row_status[row] = HighsBasisStatus::kBasic;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = 0;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_lb) {
          // Slack at lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub) {
          // Slack is at its upper bound
          assert(ipx_col_status[ipx_slack] == ipx_nonbasic_at_ub);
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      " (IPX row %2" HIGHSINT_FORMAT
                      ") has "
                      "unrecognised value ipx_col_status[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, ipx_slack,
                      (HighsInt)ipx_col_status[ipx_slack]);
        }
        // Update the slack to be used for boxed rows
        ipx_slack++;
      } else if (ipx_row_status[ipx_row] == ipx_basic) {
        // Row is basic
        highs_basis.row_status[row] = HighsBasisStatus::kBasic;
        highs_solution.row_value[row] = rhs[ipx_row] - ipx_row_value[ipx_row];
        highs_solution.row_dual[row] = 0;
      } else {
        // Nonbasic row at fixed value, lower bound or upper bound
        assert(ipx_row_status[ipx_row] ==
               -1);  // const ipx::Int ipx_nonbasic_row = -1;
        double value = rhs[ipx_row] - ipx_row_value[ipx_row];
        // @FlipRowDual -ipx_row_dual[ipx_row]; became ipx_row_dual[ipx_row];
        double dual = ipx_row_dual[ipx_row];
        if (constraint_type[ipx_row] == '>') {
          // Row is at its lower bound
          highs_basis.row_status[row] = HighsBasisStatus::kLower;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '<') {
          // Row is at its upper bound
          highs_basis.row_status[row] = HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else if (constraint_type[ipx_row] == '=') {
          // Row is at its fixed value: set HighsBasisStatus according
          // to sign of dual.
          //
          // Don't worry about maximization problems. IPX solves them
          // as minimizations with negated costs, so a negative dual
          // yields HighsBasisStatus::kUpper here, and dual signs are
          // then flipped below, so HighsBasisStatus::kUpper will have
          // corresponding positive dual.
          highs_basis.row_status[row] =
              dual >= 0 ? HighsBasisStatus::kLower : HighsBasisStatus::kUpper;
          highs_solution.row_value[row] = value;
          highs_solution.row_dual[row] = dual;
        } else {
          unrecognised = true;
          highsLogDev(log_options, HighsLogType::kError,
                      "Error in IPX conversion: Row %2" HIGHSINT_FORMAT
                      ": cannot handle "
                      "constraint_type[%2" HIGHSINT_FORMAT
                      "] = %" HIGHSINT_FORMAT "\n",
                      row, ipx_row, constraint_type[ipx_row]);
        }
      }
      // Update the IPX row index
      ipx_row++;
    }
    if (unrecognised) {
      highsLogDev(log_options, HighsLogType::kError,
                  "Bounds [%11.4g, %11.4g]\n", lp.row_lower_[row],
                  lp.row_upper_[row]);
      highsLogDev(log_options, HighsLogType::kError,
                  "Row %2" HIGHSINT_FORMAT " ipx_row_status[%2" HIGHSINT_FORMAT
                  "] = %2" HIGHSINT_FORMAT "; s[%2" HIGHSINT_FORMAT
                  "] = %11.4g; y[%2" HIGHSINT_FORMAT
                  "] = "
                  "%11.4g\n",
                  row, this_ipx_row, (HighsInt)ipx_row_status[this_ipx_row],
                  this_ipx_row, ipx_row_value[this_ipx_row], this_ipx_row,
                  ipx_row_dual[this_ipx_row]);
      assert(!unrecognised);
      highsLogUser(log_options, HighsLogType::kError,
                   "Unrecognised ipx_row_status value from IPX\n");
      return HighsStatus::kError;
    }
    if (highs_basis.row_status[row] == HighsBasisStatus::kBasic)
      num_basic_variables++;
  }
  assert(num_basic_variables == lp.num_row_);
  assert(ipx_row == ipx_solution.num_row);
  assert(ipx_slack == ipx_solution.num_col);

  if (lp.sense_ == ObjSense::kMaximize) {
    // Flip dual values since original LP is maximization
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      highs_solution.col_dual[iCol] *= -1;
    for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++)
      highs_solution.row_dual[iRow] *= -1;
  }

  if (num_boxed_rows)
    highsLogDev(log_options, HighsLogType::kInfo,
                "Of %" HIGHSINT_FORMAT " boxed rows: %" HIGHSINT_FORMAT
                " are basic and %" HIGHSINT_FORMAT " have basic slacks\n",
                num_boxed_rows, num_boxed_rows_basic,
                num_boxed_row_slacks_basic);
  // Indicate that the primal solution, dual solution and basis are valid
  highs_solution.value_valid = true;
  highs_solution.dual_valid = true;
  highs_basis.valid = true;
  highs_basis.useful = true;
  return HighsStatus::kOk;
}